

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

TSTNode<unsigned_int> * __thiscall
BurstRecursive<unsigned_int>::operator()
          (BurstRecursive<unsigned_int> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uint *oracle,
          size_t depth)

{
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar1;
  pointer ppuVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  TSTNode<unsigned_int> *pTVar6;
  TSTNode<unsigned_int> *pTVar7;
  pointer ppuVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_00;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  BurstSimple<unsigned_int> local_51;
  BurstRecursive<unsigned_int> *local_50;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_48;
  long local_40;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *local_38;
  
  local_50 = this;
  pTVar6 = BurstSimple<unsigned_int>::operator()(&local_51,bucket,oracle,depth);
  pvVar1 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
           (pTVar6->buckets)._M_elems[0];
  bucket_00 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
              (pTVar6->buckets)._M_elems[1];
  local_38 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (pTVar6->buckets)._M_elems[2];
  uVar12 = (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  ppuVar2 = (pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar10 = (long)(pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3;
  ppuVar8 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar8 >> 3;
  local_40 = uVar9 + uVar10;
  if (((long)(local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3) + local_40 != uVar12) {
    __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                  ,0x6c,
                  "TSTNode<CharT> *BurstRecursive<unsigned int>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned int, BucketT = std::vector<unsigned char *>]"
                 );
  }
  uVar12 = (ulong)((float)uVar12 * 0.7);
  uVar14 = 100;
  if (100 < (uint)uVar12) {
    uVar14 = uVar12 & 0xffffffff;
  }
  if (uVar14 < uVar10) {
    uVar5 = 1;
    uVar9 = 0;
    do {
      puVar3 = ppuVar2[uVar9];
      if (puVar3 == (uchar *)0x0) goto LAB_001b10ba;
      if (puVar3[depth] == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint)puVar3[depth] << 0x18;
        if (puVar3[depth + 1] != 0) {
          uVar11 = uVar11 | (uint)puVar3[depth + 1] << 0x10;
          if (puVar3[depth + 2] != '\0') {
            uVar11 = uVar11 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
          }
        }
      }
      oracle[uVar9] = uVar11;
      uVar9 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar9 < uVar10);
    local_48 = bucket_00;
    pTVar7 = operator()(local_50,pvVar1,oracle,depth);
    (pTVar6->buckets)._M_elems[0] = pTVar7;
    ppuVar2 = (pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar2 != (pointer)0x0) {
      operator_delete(ppuVar2);
    }
    operator_delete(pvVar1);
    *(byte *)&(pTVar6->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar6->is_tst).super__Base_bitset<1UL>._M_w | 1;
    ppuVar8 = (local_48->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(local_48->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar8 >> 3;
    bucket_00 = local_48;
  }
  if ((uVar14 < uVar9) && ((char)pTVar6->pivot != '\0')) {
    uVar12 = 0;
    uVar13 = 1;
    do {
      puVar3 = ppuVar8[uVar12];
      if (puVar3 == (uchar *)0x0) goto LAB_001b10ba;
      if (puVar3[depth + 4] == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)puVar3[depth + 4] << 0x18;
        if (puVar3[depth + 5] != 0) {
          uVar5 = uVar5 | (uint)puVar3[depth + 5] << 0x10;
          if (puVar3[depth + 6] != '\0') {
            uVar5 = uVar5 | CONCAT11(puVar3[depth + 6],puVar3[depth + 7]);
          }
        }
      }
      (oracle + uVar10)[uVar12] = uVar5;
      bVar4 = uVar13 < uVar9;
      uVar12 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar4);
    pTVar7 = operator()(local_50,bucket_00,oracle + uVar10,depth + 4);
    (pTVar6->buckets)._M_elems[1] = pTVar7;
    ppuVar2 = (bucket_00->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar2 != (pointer)0x0) {
      operator_delete(ppuVar2);
    }
    operator_delete(bucket_00);
    *(byte *)&(pTVar6->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar6->is_tst).super__Base_bitset<1UL>._M_w | 2;
  }
  pvVar1 = local_38;
  ppuVar2 = (local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(local_38->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppuVar2 >> 3;
  if (uVar14 < uVar9) {
    uVar5 = 1;
    uVar10 = 0;
    do {
      puVar3 = ppuVar2[uVar10];
      if (puVar3 == (uchar *)0x0) {
LAB_001b10ba:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint)puVar3[depth] << 0x18;
        if (puVar3[depth + 1] != 0) {
          uVar11 = uVar11 | (uint)puVar3[depth + 1] << 0x10;
          if (puVar3[depth + 2] != '\0') {
            uVar11 = uVar11 | CONCAT11(puVar3[depth + 2],puVar3[depth + 3]);
          }
        }
      }
      (oracle + local_40)[uVar10] = uVar11;
      uVar10 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar10 < uVar9);
    pTVar7 = operator()(local_50,local_38,oracle + local_40,depth);
    (pTVar6->buckets)._M_elems[2] = pTVar7;
    ppuVar2 = (pvVar1->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (ppuVar2 != (pointer)0x0) {
      operator_delete(ppuVar2);
    }
    operator_delete(pvVar1);
    *(byte *)&(pTVar6->is_tst).super__Base_bitset<1UL>._M_w =
         (byte)(pTVar6->is_tst).super__Base_bitset<1UL>._M_w | 4;
  }
  return pTVar6;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}